

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O2

int erkStep_PrintAllStats(ARKodeMem ark_mem,FILE *outfile,SUNOutputFormat fmt)

{
  int iVar1;
  ARKodeERKStepMem in_RAX;
  ARKodeERKStepMem step_mem;
  
  step_mem = in_RAX;
  iVar1 = erkStep_AccessStepMem(ark_mem,"erkStep_PrintAllStats",&step_mem);
  if (iVar1 == 0) {
    if (fmt == SUN_OUTPUTFORMAT_CSV) {
      iVar1 = 0;
      fprintf((FILE *)outfile,",RHS fn evals,%ld",step_mem->nfe);
      fputc(10,(FILE *)outfile);
    }
    else if (fmt == SUN_OUTPUTFORMAT_TABLE) {
      iVar1 = 0;
      fprintf((FILE *)outfile,"RHS fn evals                 = %ld\n",step_mem->nfe);
    }
    else {
      iVar1 = -0x16;
      arkProcessError(ark_mem,-0x16,0x18d,"erkStep_PrintAllStats",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_erkstep_io.c"
                      ,"Invalid formatting option.");
    }
  }
  return iVar1;
}

Assistant:

int erkStep_PrintAllStats(ARKodeMem ark_mem, FILE* outfile, SUNOutputFormat fmt)
{
  ARKodeERKStepMem step_mem;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  switch (fmt)
  {
  case SUN_OUTPUTFORMAT_TABLE:
    fprintf(outfile, "RHS fn evals                 = %ld\n", step_mem->nfe);
    break;
  case SUN_OUTPUTFORMAT_CSV:
    fprintf(outfile, ",RHS fn evals,%ld", step_mem->nfe);
    fprintf(outfile, "\n");
    break;
  default:
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Invalid formatting option.");
    return (ARK_ILL_INPUT);
  }

  return (ARK_SUCCESS);
}